

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O0

int __thiscall jbcoin::base_uint<160UL,_void>::signum(base_uint<160UL,_void> *this)

{
  int local_1c;
  int i;
  base_uint<160UL,_void> *this_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      return 0;
    }
    if (this->pn[local_1c] != 0) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

int signum() const
    {
        for (int i = 0; i < WIDTH; i++)
            if (pn[i] != 0)
                return 1;

        return 0;
    }